

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptSet>::Get
          (RecyclableCollectionObjectWalker<Js::JavascriptSet> *this,int i,
          ResolvedObject *pResolvedObject)

{
  StringBuilder<Memory::ArenaAllocator> *this_00;
  Var aValue;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  IDiagObjectModelDisplay *pIVar6;
  RecyclableObject *this_01;
  Type TVar7;
  
  this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
            stringBuilder;
  this_00->length = 0;
  this_00->count = 0;
  this_00->firstChunk = (Data *)0x0;
  this_00->secondChunk = (Data *)0x0;
  this_00->lastChunk = (Data *)0x0;
  StringBuilder<Memory::ArenaAllocator>::AppendUint64(this_00,(long)i);
  pcVar4 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
  pResolvedObject->name = pcVar4;
  pResolvedObject->propId = -1;
  aValue = this->instance;
  pResolvedObject->obj = aValue;
  pResolvedObject->scriptContext = this->scriptContext;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_007f6c87;
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    TVar7 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
      TVar7 = TypeIds_Number;
      goto LAB_007f6b89;
    }
    this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_007f6c87;
      *puVar5 = 0;
    }
    TVar7 = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar3 = RecyclableObject::IsExternal(this_01), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_007f6c87:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
LAB_007f6b89:
  pResolvedObject->typeId = TVar7;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  pIVar6 = CreateTDataDisplay(this,pResolvedObject,i);
  pResolvedObject->objectDisplay = pIVar6;
  return 1;
}

Assistant:

BOOL RecyclableCollectionObjectWalker<TData>::Get(int i, ResolvedObject* pResolvedObject)
    {
        auto builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
        builder->Reset();
        builder->AppendUint64(i);
        pResolvedObject->name = builder->Detach();
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        pResolvedObject->objectDisplay = CreateTDataDisplay(pResolvedObject, i);

        return TRUE;
    }